

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtls_openssl.cpp
# Opt level: O2

uint __thiscall
QTlsPrivate::TlsCryptographOpenSSL::pskClientTlsCallback
          (TlsCryptographOpenSSL *this,char *hint,char *identity,uint max_identity_len,uchar *psk,
          uint max_psk_len)

{
  qsizetype qVar1;
  int iVar2;
  size_t sVar3;
  char *__src;
  P _a_1;
  size_t sVar4;
  P _a;
  long in_FS_OFFSET;
  QSslPreSharedKeyAuthenticator authenticator;
  QArrayDataPointer<char> local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = 0xaaaaaaaaaaaaaaaa;
  QSslPreSharedKeyAuthenticator::QSslPreSharedKeyAuthenticator
            ((QSslPreSharedKeyAuthenticator *)&local_40);
  sVar4 = 0;
  iVar2 = 0;
  if (hint != (char *)0x0) {
    sVar3 = strlen(hint);
    iVar2 = (int)sVar3;
  }
  QTlsBackend::setupClientPskAuth
            ((QSslPreSharedKeyAuthenticator *)&local_40,hint,iVar2,max_identity_len,max_psk_len);
  QSslSocket::preSharedKeyAuthenticationRequired((QSslPreSharedKeyAuthenticator *)this->q);
  QSslPreSharedKeyAuthenticator::preSharedKey();
  qVar1 = local_58.size;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  if (qVar1 != 0) {
    QSslPreSharedKeyAuthenticator::identity();
    qVar1 = local_58.size;
    iVar2 = QSslPreSharedKeyAuthenticator::maximumIdentityLength();
    sVar4 = (long)iVar2;
    if (qVar1 < iVar2) {
      sVar4 = qVar1;
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    QSslPreSharedKeyAuthenticator::identity();
    __src = local_58.ptr;
    if (local_58.ptr == (char *)0x0) {
      __src = (char *)&QByteArray::_empty;
    }
    memcpy(identity,__src,sVar4);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    identity[sVar4] = '\0';
    QSslPreSharedKeyAuthenticator::preSharedKey();
    iVar2 = QSslPreSharedKeyAuthenticator::maximumPreSharedKeyLength();
    sVar4 = (long)iVar2;
    if (local_58.size < iVar2) {
      sVar4 = local_58.size;
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    QSslPreSharedKeyAuthenticator::preSharedKey();
    if (local_58.ptr == (char *)0x0) {
      local_58.ptr = (char *)&QByteArray::_empty;
    }
    memcpy(psk,local_58.ptr,sVar4);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  }
  QSslPreSharedKeyAuthenticator::~QSslPreSharedKeyAuthenticator
            ((QSslPreSharedKeyAuthenticator *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (uint)sVar4;
  }
  __stack_chk_fail();
}

Assistant:

unsigned TlsCryptographOpenSSL::pskClientTlsCallback(const char *hint, char *identity,
                                                     unsigned max_identity_len,
                                                     unsigned char *psk, unsigned max_psk_len)
{
    Q_ASSERT(q);

    QSslPreSharedKeyAuthenticator authenticator;
    // Fill in some read-only fields (for the user)
    const int hintLength = hint ? int(std::strlen(hint)) : 0;
    QTlsBackend::setupClientPskAuth(&authenticator, hint, hintLength, max_identity_len, max_psk_len);
    // Let the client provide the remaining bits...
    emit q->preSharedKeyAuthenticationRequired(&authenticator);

    // No PSK set? Return now to make the handshake fail
    if (authenticator.preSharedKey().isEmpty())
        return 0;

    // Copy data back into OpenSSL
    const int identityLength = qMin(authenticator.identity().size(), authenticator.maximumIdentityLength());
    std::memcpy(identity, authenticator.identity().constData(), identityLength);
    identity[identityLength] = 0;

    const int pskLength = qMin(authenticator.preSharedKey().size(), authenticator.maximumPreSharedKeyLength());
    std::memcpy(psk, authenticator.preSharedKey().constData(), pskLength);
    return pskLength;
}